

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O2

void __thiscall helics::MessageFederate::MessageFederate(MessageFederate *this,char *configString)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,configString,&local_31);
  MessageFederate(this,(string_view)ZEXT816(0),&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

MessageFederate::MessageFederate(const char* configString):
    MessageFederate(std::string_view{}, std::string{configString})
{
}